

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O1

void iCopyPaletted<cBGRA,bOverlay>
               (BYTE *buffer,BYTE *patch,int srcwidth,int srcheight,int Pitch,int step_x,int step_y,
               int rotate,PalEntry *palette,FCopyInfo *inf)

{
  byte bVar1;
  byte bVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  byte *pbVar9;
  
  if (0 < srcheight) {
    uVar3 = 0;
    iVar4 = 0;
    do {
      if (0 < srcwidth) {
        lVar8 = (long)iVar4;
        uVar6 = 0;
        pbVar9 = patch;
        do {
          bVar2 = *pbVar9;
          bVar1 = palette[bVar2].field_0.field_0.a;
          if (bVar1 != 0) {
            uVar7 = (uint)bVar1;
            uVar5 = uVar7 ^ 0xff;
            buffer[uVar6 * 4 + lVar8 + 2] =
                 (BYTE)((ulong)(buffer[uVar6 * 4 + lVar8 + 2] * uVar5 +
                               palette[bVar2].field_0.field_0.r * uVar7) * 0x1010102 >> 0x20);
            buffer[uVar6 * 4 + lVar8 + 1] =
                 (BYTE)((ulong)(buffer[uVar6 * 4 + lVar8 + 1] * uVar5 +
                               palette[bVar2].field_0.field_0.g * uVar7) * 0x1010102 >> 0x20);
            buffer[uVar6 * 4 + lVar8] =
                 (BYTE)((ulong)(buffer[uVar6 * 4 + lVar8] * uVar5 +
                               palette[bVar2].field_0.field_0.b * uVar7) * 0x1010102 >> 0x20);
            bVar2 = buffer[uVar6 * 4 + lVar8 + 3];
            if (buffer[uVar6 * 4 + lVar8 + 3] < bVar1) {
              bVar2 = bVar1;
            }
            buffer[uVar6 * 4 + lVar8 + 3] = bVar2;
          }
          uVar6 = uVar6 + 1;
          pbVar9 = pbVar9 + step_x;
        } while ((uint)srcwidth != uVar6);
      }
      uVar3 = uVar3 + 1;
      iVar4 = iVar4 + Pitch;
      patch = patch + step_y;
    } while (uVar3 != (uint)srcheight);
  }
  return;
}

Assistant:

void iCopyPaletted(BYTE *buffer, const BYTE * patch, int srcwidth, int srcheight, int Pitch,
					int step_x, int step_y, int rotate, PalEntry * palette, FCopyInfo *inf)
{
	int x,y,pos;

	for (y=0;y<srcheight;y++)
	{
		pos = y*Pitch;
		for (x=0;x<srcwidth;x++,pos+=4)
		{
			int v=(unsigned char)patch[y*step_y+x*step_x];
			int a = palette[v].a;

			if (TBlend::ProcessAlpha0() || a)
			{
				TBlend::OpC(buffer[pos + TDest::RED], palette[v].r, a, inf);
				TBlend::OpC(buffer[pos + TDest::GREEN], palette[v].g, a, inf);
				TBlend::OpC(buffer[pos + TDest::BLUE], palette[v].b, a, inf);
				TBlend::OpA(buffer[pos + TDest::ALPHA], a, inf);
			}
		}
	}
}